

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomenv.cpp
# Opt level: O2

void RandAddStaticEnv(CSHA512 *hasher)

{
  long lVar1;
  undefined4 uVar2;
  int iVar3;
  __pid_t _Var4;
  uchar *puVar5;
  size_t sVar6;
  long lVar7;
  uint32_t leaf;
  uint uVar8;
  uint32_t maxsub;
  uint32_t uVar9;
  uint32_t subleaf;
  uint32_t subleaf_00;
  long in_FS_OFFSET;
  __gid_t local_2f4;
  __gid_t local_2f0;
  __uid_t local_2ec;
  __uid_t local_2e8;
  __pid_t local_2e4;
  __pid_t local_2e0;
  __pid_t local_2dc;
  undefined *local_2d8;
  ifaddrs *local_2d0;
  ifaddrs *ifad;
  utsname name;
  char hname [256];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_2d0 = (ifaddrs *)CONCAT71(local_2d0._1_7_,1);
  CSHA512::Write(hasher,(uchar *)&local_2d0,1);
  name.sysname[0] = '\b';
  name.sysname[1] = '\0';
  name.sysname[2] = '\0';
  name.sysname[3] = '\0';
  name.sysname[4] = '\0';
  name.sysname[5] = '\0';
  name.sysname[6] = '\0';
  name.sysname[7] = '\0';
  (anonymous_namespace)::operator<<(hasher,(unsigned_long *)&name);
  hname[0] = '\b';
  hname[1] = '\0';
  hname[2] = '\0';
  hname[3] = '\0';
  hname[4] = '\0';
  hname[5] = '\0';
  hname[6] = '\0';
  hname[7] = '\0';
  (anonymous_namespace)::operator<<(hasher,(unsigned_long *)hname);
  ifad = (ifaddrs *)0x4;
  (anonymous_namespace)::operator<<(hasher,(unsigned_long *)&ifad);
  name.sysname[0] = '\x04';
  name.sysname[1] = '\0';
  name.sysname[2] = '\0';
  name.sysname[3] = '\0';
  (anonymous_namespace)::operator<<(hasher,(int *)&name);
  hname[0] = '\x02';
  hname[1] = '\0';
  hname[2] = '\0';
  hname[3] = '\0';
  (anonymous_namespace)::operator<<(hasher,(int *)hname);
  ifad = (ifaddrs *)CONCAT44(ifad._4_4_,1);
  (anonymous_namespace)::operator<<(hasher,(int *)&ifad);
  builtin_strncpy(name.sysname,"\x12\x15\x03",4);
  name.sysname[4] = '\0';
  name.sysname[5] = '\0';
  name.sysname[6] = '\0';
  name.sysname[7] = '\0';
  (anonymous_namespace)::operator<<(hasher,(long *)&name);
  name.sysname[0] = -0x44;
  name.sysname[1] = '\x02';
  name.sysname[2] = '\0';
  name.sysname[3] = '\0';
  (anonymous_namespace)::operator<<(hasher,(int *)&name);
  CSHA512::Write(hasher,(uchar *)
                        "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
                 ,0x66);
  (anonymous_namespace)::operator<<(hasher,&CLIENT_VERSION);
  name.sysname._0_8_ = getauxval(0x10);
  (anonymous_namespace)::operator<<(hasher,(unsigned_long *)&name);
  name.sysname._0_8_ = getauxval(0x1a);
  (anonymous_namespace)::operator<<(hasher,(unsigned_long *)&name);
  puVar5 = (uchar *)getauxval(0x19);
  if (puVar5 != (uchar *)0x0) {
    CSHA512::Write(hasher,puVar5,0x10);
  }
  puVar5 = (uchar *)getauxval(0xf);
  if (puVar5 != (uchar *)0x0) {
    sVar6 = strlen((char *)puVar5);
    CSHA512::Write(hasher,puVar5,sVar6 + 1);
  }
  puVar5 = (uchar *)getauxval(0x1f);
  if (puVar5 != (uchar *)0x0) {
    sVar6 = strlen((char *)puVar5);
    CSHA512::Write(hasher,puVar5,sVar6 + 1);
  }
  anon_unknown.dwarf_11bb9cc::AddCPUID
            (hasher,0,0,(uint32_t *)&name,(uint32_t *)hname,(uint32_t *)&ifad,(uint32_t *)&local_2d0
            );
  iVar3 = 0xff;
  if ((uint)name.sysname._0_4_ < 0xff) {
    iVar3 = name.sysname._0_4_;
  }
  uVar8 = 1;
  do {
    if (uVar8 == iVar3 + 1U) {
      anon_unknown.dwarf_11bb9cc::AddCPUID
                (hasher,0x80000000,0,(uint32_t *)&name,(uint32_t *)hname,(uint32_t *)&ifad,
                 (uint32_t *)&local_2d0);
      uVar2 = name.sysname._0_4_;
      for (uVar8 = 0x80000001; (uVar8 <= (uint)uVar2 && (uVar8 < 0x80000100)); uVar8 = uVar8 + 1) {
        anon_unknown.dwarf_11bb9cc::AddCPUID
                  (hasher,uVar8,0,(uint32_t *)&name,(uint32_t *)hname,(uint32_t *)&ifad,
                   (uint32_t *)&local_2d0);
      }
      name.sysname._0_8_ = hasher;
      CSHA512::Write(hasher,(uchar *)&name,8);
      hname._0_8_ = RandAddStaticEnv;
      CSHA512::Write(hasher,(uchar *)hname,8);
      ifad = (ifaddrs *)malloc;
      CSHA512::Write(hasher,(uchar *)&ifad,8);
      local_2d0 = (ifaddrs *)__errno_location();
      CSHA512::Write(hasher,(uchar *)&local_2d0,8);
      local_2d8 = &environ;
      CSHA512::Write(hasher,(uchar *)&local_2d8,8);
      iVar3 = gethostname(hname,0x100);
      if (iVar3 == 0) {
        sVar6 = strnlen(hname,0x100);
        CSHA512::Write(hasher,(uchar *)hname,sVar6);
      }
      ifad = (ifaddrs *)0x0;
      getifaddrs((ifaddrs *)&ifad);
      local_2d0 = (ifaddrs *)&ifad;
      while (local_2d0 = local_2d0->ifa_next, local_2d0 != (ifaddrs *)0x0) {
        CSHA512::Write(hasher,(uchar *)&local_2d0,8);
        puVar5 = (uchar *)local_2d0->ifa_name;
        sVar6 = strlen((char *)puVar5);
        CSHA512::Write(hasher,puVar5,sVar6 + 1);
        CSHA512::Write(hasher,(uchar *)&local_2d0->ifa_flags,4);
        anon_unknown.dwarf_11bb9cc::AddSockaddr(hasher,local_2d0->ifa_addr);
        anon_unknown.dwarf_11bb9cc::AddSockaddr(hasher,local_2d0->ifa_netmask);
        anon_unknown.dwarf_11bb9cc::AddSockaddr(hasher,(local_2d0->ifa_ifu).ifu_broadaddr);
      }
      freeifaddrs(ifad);
      iVar3 = uname((utsname *)&name);
      if (iVar3 != -1) {
        sVar6 = strlen(name.sysname);
        CSHA512::Write(hasher,(uchar *)&name,sVar6 + 1);
        sVar6 = strlen(name.nodename);
        CSHA512::Write(hasher,(uchar *)name.nodename,sVar6 + 1);
        sVar6 = strlen(name.release);
        CSHA512::Write(hasher,(uchar *)name.release,sVar6 + 1);
        sVar6 = strlen(name.version);
        CSHA512::Write(hasher,(uchar *)name.version,sVar6 + 1);
        sVar6 = strlen(name.machine);
        CSHA512::Write(hasher,(uchar *)name.machine,sVar6 + 1);
      }
      anon_unknown.dwarf_11bb9cc::AddPath(hasher,"/");
      anon_unknown.dwarf_11bb9cc::AddPath(hasher,".");
      anon_unknown.dwarf_11bb9cc::AddPath(hasher,"/tmp");
      anon_unknown.dwarf_11bb9cc::AddPath(hasher,"/home");
      anon_unknown.dwarf_11bb9cc::AddPath(hasher,"/proc");
      anon_unknown.dwarf_11bb9cc::AddFile(hasher,"/proc/cmdline");
      anon_unknown.dwarf_11bb9cc::AddFile(hasher,"/proc/cpuinfo");
      anon_unknown.dwarf_11bb9cc::AddFile(hasher,"/proc/version");
      anon_unknown.dwarf_11bb9cc::AddFile(hasher,"/etc/passwd");
      anon_unknown.dwarf_11bb9cc::AddFile(hasher,"/etc/group");
      anon_unknown.dwarf_11bb9cc::AddFile(hasher,"/etc/hosts");
      anon_unknown.dwarf_11bb9cc::AddFile(hasher,"/etc/resolv.conf");
      anon_unknown.dwarf_11bb9cc::AddFile(hasher,"/etc/timezone");
      anon_unknown.dwarf_11bb9cc::AddFile(hasher,"/etc/localtime");
      if (_environ != 0) {
        for (lVar7 = 0; puVar5 = *(uchar **)(_environ + lVar7), puVar5 != (uchar *)0x0;
            lVar7 = lVar7 + 8) {
          sVar6 = strlen((char *)puVar5);
          CSHA512::Write(hasher,puVar5,sVar6);
        }
      }
      _Var4 = getpid();
      local_2d8 = (undefined *)CONCAT44(local_2d8._4_4_,_Var4);
      (anonymous_namespace)::operator<<(hasher,(int *)&local_2d8);
      local_2dc = getppid();
      (anonymous_namespace)::operator<<(hasher,&local_2dc);
      local_2e0 = getsid(0);
      (anonymous_namespace)::operator<<(hasher,&local_2e0);
      local_2e4 = getpgid(0);
      (anonymous_namespace)::operator<<(hasher,&local_2e4);
      local_2e8 = getuid();
      (anonymous_namespace)::operator<<(hasher,&local_2e8);
      local_2ec = geteuid();
      (anonymous_namespace)::operator<<(hasher,&local_2ec);
      local_2f0 = getgid();
      (anonymous_namespace)::operator<<(hasher,&local_2f0);
      local_2f4 = getegid();
      (anonymous_namespace)::operator<<(hasher,&local_2f4);
      local_2d8 = (undefined *)pthread_self();
      CSHA512::Write(hasher,(uchar *)&local_2d8,8);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
    uVar9 = 0;
    for (subleaf_00 = 0; subleaf_00 != 0x100; subleaf_00 = subleaf_00 + 1) {
      anon_unknown.dwarf_11bb9cc::AddCPUID
                (hasher,uVar8,subleaf_00,(uint32_t *)&name,(uint32_t *)hname,(uint32_t *)&ifad,
                 (uint32_t *)&local_2d0);
      switch(uVar8 & 0xff) {
      case 4:
        if ((name.sysname._0_8_ & 0x1f) == 0) goto switchD_003838b2_caseD_5;
        break;
      default:
        goto switchD_003838b2_caseD_5;
      case 7:
        if (subleaf_00 == 0) {
          uVar9 = name.sysname._0_4_;
        }
        if (subleaf_00 == uVar9) goto switchD_003838b2_caseD_5;
        break;
      case 0xb:
        if (ifad._1_1_ == '\0') goto switchD_003838b2_caseD_5;
        break;
      case 0xd:
        if ((((name.sysname._0_4_ == 0) && (hname._0_4_ == 0)) && ((int)ifad == 0)) &&
           ((int)local_2d0 == 0)) goto switchD_003838b2_caseD_5;
      }
    }
switchD_003838b2_caseD_5:
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void RandAddStaticEnv(CSHA512& hasher)
{
    // Some compile-time static properties
    hasher << (CHAR_MIN < 0) << sizeof(void*) << sizeof(long) << sizeof(int);
#if defined(__GNUC__) && defined(__GNUC_MINOR__) && defined(__GNUC_PATCHLEVEL__)
    hasher << __GNUC__ << __GNUC_MINOR__ << __GNUC_PATCHLEVEL__;
#endif
#ifdef _MSC_VER
    hasher << _MSC_VER;
#endif
    hasher << __cplusplus;
#ifdef _XOPEN_VERSION
    hasher << _XOPEN_VERSION;
#endif
#ifdef __VERSION__
    const char* COMPILER_VERSION = __VERSION__;
    hasher.Write((const unsigned char*)COMPILER_VERSION, strlen(COMPILER_VERSION) + 1);
#endif

    // Bitcoin client version
    hasher << CLIENT_VERSION;

#if defined(HAVE_STRONG_GETAUXVAL)
    // Information available through getauxval()
#  ifdef AT_HWCAP
    hasher << getauxval(AT_HWCAP);
#  endif
#  ifdef AT_HWCAP2
    hasher << getauxval(AT_HWCAP2);
#  endif
#  ifdef AT_RANDOM
    const unsigned char* random_aux = (const unsigned char*)getauxval(AT_RANDOM);
    if (random_aux) hasher.Write(random_aux, 16);
#  endif
#  ifdef AT_PLATFORM
    const char* platform_str = (const char*)getauxval(AT_PLATFORM);
    if (platform_str) hasher.Write((const unsigned char*)platform_str, strlen(platform_str) + 1);
#  endif
#  ifdef AT_EXECFN
    const char* exec_str = (const char*)getauxval(AT_EXECFN);
    if (exec_str) hasher.Write((const unsigned char*)exec_str, strlen(exec_str) + 1);
#  endif
#endif // HAVE_STRONG_GETAUXVAL

#ifdef HAVE_GETCPUID
    AddAllCPUID(hasher);
#endif

    // Memory locations
    hasher << &hasher << &RandAddStaticEnv << &malloc << &errno << &environ;

    // Hostname
#ifdef WIN32
    constexpr DWORD max_size = MAX_COMPUTERNAME_LENGTH + 1;
    char hname[max_size];
    DWORD size = max_size;
    if (GetComputerNameA(hname, &size) != 0) {
        hasher.Write(UCharCast(hname), size);
    }
#else
    char hname[256];
    if (gethostname(hname, 256) == 0) {
        hasher.Write((const unsigned char*)hname, strnlen(hname, 256));
    }
#endif

#if HAVE_DECL_GETIFADDRS && HAVE_DECL_FREEIFADDRS
    // Network interfaces
    struct ifaddrs *ifad = nullptr;
    getifaddrs(&ifad);
    struct ifaddrs *ifit = ifad;
    while (ifit != nullptr) {
        hasher.Write((const unsigned char*)&ifit, sizeof(ifit));
        hasher.Write((const unsigned char*)ifit->ifa_name, strlen(ifit->ifa_name) + 1);
        hasher.Write((const unsigned char*)&ifit->ifa_flags, sizeof(ifit->ifa_flags));
        AddSockaddr(hasher, ifit->ifa_addr);
        AddSockaddr(hasher, ifit->ifa_netmask);
        AddSockaddr(hasher, ifit->ifa_dstaddr);
        ifit = ifit->ifa_next;
    }
    freeifaddrs(ifad);
#endif

#ifndef WIN32
    // UNIX kernel information
    struct utsname name;
    if (uname(&name) != -1) {
        hasher.Write((const unsigned char*)&name.sysname, strlen(name.sysname) + 1);
        hasher.Write((const unsigned char*)&name.nodename, strlen(name.nodename) + 1);
        hasher.Write((const unsigned char*)&name.release, strlen(name.release) + 1);
        hasher.Write((const unsigned char*)&name.version, strlen(name.version) + 1);
        hasher.Write((const unsigned char*)&name.machine, strlen(name.machine) + 1);
    }

    /* Path and filesystem provided data */
    AddPath(hasher, "/");
    AddPath(hasher, ".");
    AddPath(hasher, "/tmp");
    AddPath(hasher, "/home");
    AddPath(hasher, "/proc");
#ifdef __linux__
    AddFile(hasher, "/proc/cmdline");
    AddFile(hasher, "/proc/cpuinfo");
    AddFile(hasher, "/proc/version");
#endif
    AddFile(hasher, "/etc/passwd");
    AddFile(hasher, "/etc/group");
    AddFile(hasher, "/etc/hosts");
    AddFile(hasher, "/etc/resolv.conf");
    AddFile(hasher, "/etc/timezone");
    AddFile(hasher, "/etc/localtime");
#endif

    // For MacOS/BSDs, gather data through sysctl instead of /proc. Not all of these
    // will exist on every system.
#ifdef HAVE_SYSCTL
#  ifdef CTL_HW
#    ifdef HW_MACHINE
    AddSysctl<CTL_HW, HW_MACHINE>(hasher);
#    endif
#    ifdef HW_MODEL
    AddSysctl<CTL_HW, HW_MODEL>(hasher);
#    endif
#    ifdef HW_NCPU
    AddSysctl<CTL_HW, HW_NCPU>(hasher);
#    endif
#    ifdef HW_PHYSMEM
    AddSysctl<CTL_HW, HW_PHYSMEM>(hasher);
#    endif
#    ifdef HW_USERMEM
    AddSysctl<CTL_HW, HW_USERMEM>(hasher);
#    endif
#    ifdef HW_MACHINE_ARCH
    AddSysctl<CTL_HW, HW_MACHINE_ARCH>(hasher);
#    endif
#    ifdef HW_REALMEM
    AddSysctl<CTL_HW, HW_REALMEM>(hasher);
#    endif
#    ifdef HW_CPU_FREQ
    AddSysctl<CTL_HW, HW_CPU_FREQ>(hasher);
#    endif
#    ifdef HW_BUS_FREQ
    AddSysctl<CTL_HW, HW_BUS_FREQ>(hasher);
#    endif
#    ifdef HW_CACHELINE
    AddSysctl<CTL_HW, HW_CACHELINE>(hasher);
#    endif
#  endif
#  ifdef CTL_KERN
#    ifdef KERN_BOOTFILE
     AddSysctl<CTL_KERN, KERN_BOOTFILE>(hasher);
#    endif
#    ifdef KERN_BOOTTIME
     AddSysctl<CTL_KERN, KERN_BOOTTIME>(hasher);
#    endif
#    ifdef KERN_CLOCKRATE
     AddSysctl<CTL_KERN, KERN_CLOCKRATE>(hasher);
#    endif
#    ifdef KERN_HOSTID
     AddSysctl<CTL_KERN, KERN_HOSTID>(hasher);
#    endif
#    ifdef KERN_HOSTUUID
     AddSysctl<CTL_KERN, KERN_HOSTUUID>(hasher);
#    endif
#    ifdef KERN_HOSTNAME
     AddSysctl<CTL_KERN, KERN_HOSTNAME>(hasher);
#    endif
#    ifdef KERN_OSRELDATE
     AddSysctl<CTL_KERN, KERN_OSRELDATE>(hasher);
#    endif
#    ifdef KERN_OSRELEASE
     AddSysctl<CTL_KERN, KERN_OSRELEASE>(hasher);
#    endif
#    ifdef KERN_OSREV
     AddSysctl<CTL_KERN, KERN_OSREV>(hasher);
#    endif
#    ifdef KERN_OSTYPE
     AddSysctl<CTL_KERN, KERN_OSTYPE>(hasher);
#    endif
#    ifdef KERN_POSIX1
     AddSysctl<CTL_KERN, KERN_OSREV>(hasher);
#    endif
#    ifdef KERN_VERSION
     AddSysctl<CTL_KERN, KERN_VERSION>(hasher);
#    endif
#  endif
#endif

    // Env variables
    if (environ) {
        for (size_t i = 0; environ[i]; ++i) {
            hasher.Write((const unsigned char*)environ[i], strlen(environ[i]));
        }
    }

    // Process, thread, user, session, group, ... ids.
#ifdef WIN32
    hasher << GetCurrentProcessId() << GetCurrentThreadId();
#else
    hasher << getpid() << getppid() << getsid(0) << getpgid(0) << getuid() << geteuid() << getgid() << getegid();
#endif
    hasher << std::this_thread::get_id();
}